

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Wec_t * Gia_ManIsoStrashReduceInt(Gia_Man_t *p,Vec_Wec_t *vSupps,int fVerbose)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void *__s;
  Gia_Man_t *p_01;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar7 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(40000);
  pVVar7->pArray = piVar8;
  uVar5 = Gia_ManCoSuppSizeMax(p,vSupps);
  iVar6 = 0x10;
  if (0xe < uVar5) {
    iVar6 = uVar5 + 1;
  }
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)(uVar5 + 1) << 2);
  }
  iVar6 = vSupps->nSize;
  if (0 < (long)iVar6) {
    pVVar10 = vSupps->pArray;
    lVar11 = 0;
    do {
      iVar1 = *(int *)((long)&pVVar10->nSize + lVar11);
      if (((long)iVar1 < 0) || ((int)uVar5 < iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar8 = (int *)((long)__s + (long)iVar1 * 4);
      *piVar8 = *piVar8 + 1;
      lVar11 = lVar11 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar11);
  }
  Gia_ManFillValue(p);
  p_01 = Gia_ManStart(p->nObjs);
  p->pObjs->Value = 0;
  uVar13 = uVar5;
  if (0 < (int)uVar5) {
    do {
      pGVar9 = Gia_ManAppendObj(p_01);
      uVar3 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_01->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_01->nObjs <= pGVar9)) {
LAB_001f359b:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      if ((pGVar9 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar9)) goto LAB_001f359b;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  Gia_ManHashAlloc(p_01);
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar12];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vSupps->nSize <= lVar12) {
LAB_001f3617:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar1 = *(int *)((long)&vSupps->pArray->nSize + lVar11);
      if (((long)iVar1 < 0) || ((int)uVar5 < iVar1)) {
LAB_001f35f8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s + (long)iVar1 * 4) == 1) {
        pVVar10 = Vec_WecPushLevel(p_00);
LAB_001f34f7:
        Vec_IntPush(pVVar10,(int)lVar12);
      }
      else {
        uVar13 = Gia_ManIsoStrashReduceOne
                           (p_01,p,p->pObjs + iVar6,
                            (Vec_Int_t *)((long)&vSupps->pArray->nCap + lVar11));
        Vec_IntFillExtra(pVVar7,uVar13 + 1,-1);
        if (((int)uVar13 < 0) || (pVVar7->nSize <= (int)uVar13)) goto LAB_001f35f8;
        uVar2 = pVVar7->pArray[uVar13];
        if ((ulong)uVar2 != 0xffffffff) {
          if (((int)uVar2 < 0) || (p_00->nSize <= (int)uVar2)) goto LAB_001f3617;
          pVVar10 = p_00->pArray + uVar2;
          goto LAB_001f34f7;
        }
        pVVar7->pArray[uVar13] = p_00->nSize;
        pVVar10 = Vec_WecPushLevel(p_00);
        Vec_IntPush(pVVar10,(int)lVar12);
      }
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCos;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 < pVVar10->nSize);
  }
  Gia_ManHashStop(p_01);
  Gia_ManStop(p_01);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManIsoStrashReduceInt( Gia_Man_t * p, Vec_Wec_t * vSupps, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    Vec_Int_t * vSuppOne, * vMap = Vec_IntAlloc( 10000 );
    int i, iLit, nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    // count how many times each support size appears
    Vec_Int_t * vSizeCount = Vec_IntStart( nSuppMax + 1 );
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_IntAddToEntry( vSizeCount, Vec_IntSize(vSuppOne), 1 );
    // create array of unique outputs
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntEntry(vSizeCount, Vec_IntSize(vSuppOne)) == 1 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        iLit = Gia_ManIsoStrashReduceOne( pNew, p, pObj, vSuppOne );
        Vec_IntFillExtra( vMap, iLit + 1, -1 );
        if ( Vec_IntEntry(vMap, iLit) == -1 )
        {
            Vec_IntWriteEntry( vMap, iLit, Vec_WecSize(vPosEquivs) );
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        Vec_IntPush( Vec_WecEntry(vPosEquivs, Vec_IntEntry(vMap, iLit)), i );
    }
    Gia_ManHashStop( pNew );
    Gia_ManStop( pNew );
    Vec_IntFree( vSizeCount );
    Vec_IntFree( vMap );
    return vPosEquivs;
}